

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

FBaseCVar ** __thiscall
TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::Insert
          (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *this,FName *key
          ,FBaseCVar **value)

{
  FName local_30;
  FName local_2c;
  Node *local_28;
  Node *n;
  FBaseCVar **value_local;
  FName *key_local;
  TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *this_local;
  
  n = (Node *)value;
  value_local = (FBaseCVar **)key;
  key_local = (FName *)this;
  FName::FName(&local_2c,key);
  local_28 = FindKey(this,&local_2c);
  if (local_28 == (Node *)0x0) {
    FName::FName(&local_30,key);
    local_28 = NewKey(this,&local_30);
    (local_28->Pair).Value = (FBaseCVar *)n->Next;
  }
  else {
    (local_28->Pair).Value = (FBaseCVar *)n->Next;
  }
  return &(local_28->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}